

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UdpEntrySyntax::setChild(UdpEntrySyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *pSVar2;
  TokenList *pTVar3;
  UdpEdgeIndicatorSyntax *pUVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 8) {
    switch(index) {
    case 0:
      pSVar2 = TokenOrSyntax::node(&child);
      pTVar3 = SyntaxNode::as<slang::syntax::TokenList>(pSVar2);
      (this->preInputs).super_SyntaxListBase.super_SyntaxNode.parent =
           (pTVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->preInputs).super_SyntaxListBase.super_SyntaxNode.kind =
           (pTVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->preInputs).super_SyntaxListBase.childCount = (pTVar3->super_SyntaxListBase).childCount;
      sVar1 = (pTVar3->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
      (this->preInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
           (pTVar3->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
      (this->preInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      pSVar2 = TokenOrSyntax::node(&child);
      if (pSVar2 == (SyntaxNode *)0x0) {
        pUVar4 = (UdpEdgeIndicatorSyntax *)0x0;
      }
      else {
        pSVar2 = TokenOrSyntax::node(&child);
        pUVar4 = SyntaxNode::as<slang::syntax::UdpEdgeIndicatorSyntax>(pSVar2);
      }
      this->edgeIndicator = pUVar4;
      break;
    case 2:
      pSVar2 = TokenOrSyntax::node(&child);
      pTVar3 = SyntaxNode::as<slang::syntax::TokenList>(pSVar2);
      (this->postInputs).super_SyntaxListBase.super_SyntaxNode.parent =
           (pTVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->postInputs).super_SyntaxListBase.super_SyntaxNode.kind =
           (pTVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->postInputs).super_SyntaxListBase.childCount = (pTVar3->super_SyntaxListBase).childCount
      ;
      sVar1 = (pTVar3->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
      (this->postInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
           (pTVar3->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
      (this->postInputs).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 3:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->colon1).kind = TVar5.kind;
      (this->colon1).field_0x2 = TVar5._2_1_;
      (this->colon1).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->colon1).rawLen = TVar5.rawLen;
      (this->colon1).info = TVar5.info;
      break;
    case 4:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->current).kind = TVar5.kind;
      (this->current).field_0x2 = TVar5._2_1_;
      (this->current).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->current).rawLen = TVar5.rawLen;
      (this->current).info = TVar5.info;
      break;
    case 5:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->colon2).kind = TVar5.kind;
      (this->colon2).field_0x2 = TVar5._2_1_;
      (this->colon2).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->colon2).rawLen = TVar5.rawLen;
      (this->colon2).info = TVar5.info;
      break;
    case 6:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->next).kind = TVar5.kind;
      (this->next).field_0x2 = TVar5._2_1_;
      (this->next).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->next).rawLen = TVar5.rawLen;
      (this->next).info = TVar5.info;
      break;
    case 7:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar5.kind;
      (this->semi).field_0x2 = TVar5._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->semi).rawLen = TVar5.rawLen;
      (this->semi).info = TVar5.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x33d3);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void UdpEntrySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: preInputs = child.node()->as<TokenList>(); return;
        case 1: edgeIndicator = child.node() ? &child.node()->as<UdpEdgeIndicatorSyntax>() : nullptr; return;
        case 2: postInputs = child.node()->as<TokenList>(); return;
        case 3: colon1 = child.token(); return;
        case 4: current = child.token(); return;
        case 5: colon2 = child.token(); return;
        case 6: next = child.token(); return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}